

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void webfront::log::info<>(string_view fmt)

{
  bool bVar1;
  double __x;
  
  bVar1 = anon_unknown_4::is('\x03');
  if (bVar1) {
    anon_unknown_4::log(__x);
  }
  return;
}

Assistant:

void info(string_view fmt, Ts&&... ts) { if (is(Info)) log(Info, fmt, std::forward<Ts>(ts)...); }